

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select(pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    *__return_storage_ptr__,AddrManImpl *this,bool new_only,
                   unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *networks)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  Check(this);
  Select_(__return_storage_ptr__,this,new_only,networks);
  Check(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select(bool new_only, const std::unordered_set<Network>& networks) const
{
    LOCK(cs);
    Check();
    auto addrRet = Select_(new_only, networks);
    Check();
    return addrRet;
}